

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_exception.hpp
# Opt level: O0

void __thiscall
duckdb::ConversionException::
ConversionException<std::__cxx11::string,unsigned_long,unsigned_long,std::__cxx11::string>
          (ConversionException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,unsigned_long params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  unsigned_long in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ConversionException *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string *in_R9;
  string local_90 [32];
  string local_70 [32];
  string local_50 [40];
  ConversionException *msg_00;
  
  msg_00 = in_RDI;
  std::__cxx11::string::string(local_70,in_RDX);
  std::__cxx11::string::string(local_90,in_R9);
  Exception::ConstructMessage<std::__cxx11::string,unsigned_long,unsigned_long,std::__cxx11::string>
            ((string *)msg_00,in_RSI,(unsigned_long)in_RDX,in_RCX,in_R8);
  duckdb::ConversionException::ConversionException(in_RDI,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

explicit ConversionException(const string &msg, ARGS... params)
	    : ConversionException(ConstructMessage(msg, params...)) {
	}